

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool vec3_line_segments_on_same_line(vec3 ap0,vec3 ap1,vec3 bp0,vec3 bp1,float eps)

{
  float fVar1;
  vec3 vVar2;
  vec3 vVar3;
  vec3 v2;
  undefined1 local_229;
  vec3 v1;
  vec3 v0;
  vec3 bp1_local;
  vec3 bp0_local;
  vec3 ap1_local;
  vec3 ap0_local;
  
  vVar2 = vec3_sub(ap0,ap1);
  vVar3 = vec3_sub(ap0,bp0);
  vVar2 = vec3_cross(vVar2,vVar3);
  vVar3 = vec3_sub(ap0,ap1);
  v2 = vec3_sub(ap0,bp1);
  vVar3 = vec3_cross(vVar3,v2);
  fVar1 = vec3_length_squared(vVar2);
  local_229 = false;
  if (fVar1 < eps * eps) {
    fVar1 = vec3_length_squared(vVar3);
    local_229 = fVar1 < eps * eps;
  }
  return local_229;
}

Assistant:

bool vec3_line_segments_on_same_line(vec3 ap0, vec3 ap1, vec3 bp0, vec3 bp1, float eps) {
    // Check if triangle ap0, ap1, bp0 and ap0, ap1, bp1 both have area of 0
    vec3 v0 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp0));
    vec3 v1 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp1));
    return vec3_length_squared(v0) < eps*eps && vec3_length_squared(v1) < eps*eps;
}